

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

Value * __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Matrix<float,_2,_3>_>::genRandom
          (Value *__return_storage_ptr__,DefaultSampling<tcu::Matrix<float,_2,_3>_> *this,
          FloatFormat *fmt,Precision prec,Random *rnd)

{
  long lVar1;
  float *pfVar2;
  long lVar3;
  long extraout_RDX;
  int colNdx;
  long lVar4;
  Value *this_00;
  bool bVar5;
  float fVar6;
  undefined4 uVar7;
  
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[0].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[1].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[2].m_data = 0;
  lVar1 = 0;
  pfVar2 = (float *)__return_storage_ptr__;
  do {
    lVar3 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar1 != lVar3) {
        uVar7 = 0;
      }
      pfVar2[lVar3 * 2] = (float)uVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar3 = lVar1 + 1;
    pfVar2 = pfVar2 + 1;
    bVar5 = lVar1 == 0;
    lVar1 = lVar3;
  } while (bVar5);
  this_00 = __return_storage_ptr__;
  pfVar2 = (float *)__return_storage_ptr__;
  lVar1 = 0;
  do {
    lVar4 = 0;
    do {
      fVar6 = DefaultSampling<float>::genRandom
                        ((DefaultSampling<float> *)this_00,fmt,(Precision)lVar3,rnd);
      pfVar2[lVar4 * 2] = fVar6;
      lVar4 = lVar4 + 1;
      lVar3 = extraout_RDX;
    } while (lVar4 != 3);
    pfVar2 = pfVar2 + 1;
    bVar5 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar5);
  return __return_storage_ptr__;
}

Assistant:

Value	genRandom	(const FloatFormat& fmt, Precision prec, Random& rnd) const
	{
		Value ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = instance<DefaultSampling<T> >().genRandom(fmt, prec, rnd);

		return ret;
	}